

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O3

void convolve_vert(uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
                  InterpKernel *y_filters,int y0_q4,int y_step_q4,int w,int h)

{
  int iVar1;
  uint8_t *puVar2;
  long lVar3;
  int sum;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  byte *pbVar7;
  
  if (0 < w) {
    puVar2 = src + src_stride * -3;
    iVar1 = 0;
    do {
      if (0 < h) {
        uVar5 = 0;
        uVar6 = y0_q4;
        do {
          pbVar7 = puVar2 + ((int)uVar6 >> 4) * src_stride;
          lVar3 = 0;
          iVar4 = 0;
          do {
            iVar4 = iVar4 + (int)*(short *)((long)*y_filters +
                                           lVar3 * 2 + (ulong)((uVar6 & 0xf) << 4)) * (uint)*pbVar7;
            lVar3 = lVar3 + 1;
            pbVar7 = pbVar7 + src_stride;
          } while (lVar3 != 8);
          iVar4 = iVar4 + 0x40 >> 7;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          dst[uVar5 * dst_stride] = (uint8_t)iVar4;
          uVar6 = uVar6 + y_step_q4;
          uVar5 = uVar5 + 1;
        } while (uVar5 != (uint)h);
      }
      puVar2 = puVar2 + 1;
      dst = dst + 1;
      iVar1 = iVar1 + 1;
    } while (iVar1 != w);
  }
  return;
}

Assistant:

static void convolve_vert(const uint8_t *src, ptrdiff_t src_stride,
                          uint8_t *dst, ptrdiff_t dst_stride,
                          const InterpKernel *y_filters, int y0_q4,
                          int y_step_q4, int w, int h) {
  src -= src_stride * (SUBPEL_TAPS / 2 - 1);

  for (int x = 0; x < w; ++x) {
    int y_q4 = y0_q4;
    for (int y = 0; y < h; ++y) {
      const unsigned char *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
      const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
      const int sum = vert_scalar_product(src_y, src_stride, y_filter);
      dst[y * dst_stride] = clip_pixel(ROUND_POWER_OF_TWO(sum, FILTER_BITS));
      y_q4 += y_step_q4;
    }
    ++src;
    ++dst;
  }
}